

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O1

bool __thiscall CaDiCaL::Internal::propagate(Internal *this)

{
  pointer *ppWVar1;
  int64_t *piVar2;
  char cVar3;
  Internal *pIVar4;
  Watch *pWVar5;
  pointer piVar6;
  pointer pWVar7;
  char *pcVar8;
  Clause *reason;
  pointer pVVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  size_t sVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  Watch *in_RSI;
  iterator __position;
  pointer this_00;
  char cVar21;
  ulong uVar22;
  pointer pWVar23;
  pointer pWVar24;
  pointer pWVar25;
  bool bVar26;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Watch local_60;
  ulong local_50;
  size_t local_48;
  long local_40;
  pointer local_38;
  
  pIVar4 = this->internal;
  __position._M_current = in_RSI;
  if ((pIVar4->profiles).propagate.level <= (pIVar4->opts).profile) {
    __position._M_current = (Watch *)&(pIVar4->profiles).propagate;
    time(pIVar4,(time_t *)in_RSI);
    start_profiling(pIVar4,(Profile *)__position._M_current,
                    (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  local_48 = this->propagated;
  while (bVar26 = this->conflict == (Clause *)0x0, bVar26) {
    pWVar5 = (Watch *)this->propagated;
    piVar6 = (this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    __position._M_current =
         (Watch *)((long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
    if (pWVar5 == __position._M_current) break;
    this->propagated = (size_t)((long)&pWVar5->clause + 1);
    uVar20 = piVar6[(long)pWVar5];
    uVar15 = -uVar20;
    if ((int)uVar20 < 1) {
      uVar20 = uVar15;
    }
    local_38 = (this->wtab).
               super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (uVar20 << 1 | uVar15 >> 0x1f);
    pWVar25 = (local_38->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pWVar7 = (local_38->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    local_40 = (ulong)uVar20 << 4;
    pWVar24 = pWVar25;
    do {
      pWVar23 = pWVar24;
      if (pWVar25 == pWVar7) break;
      pWVar23 = pWVar24 + 1;
      iVar11 = pWVar25->blit;
      iVar12 = pWVar25->size;
      pWVar24->clause = pWVar25->clause;
      pWVar24->blit = iVar11;
      pWVar24->size = iVar12;
      uVar20 = pWVar24->blit;
      pcVar8 = this->vals;
      if (pcVar8[(int)uVar20] < '\x01') {
        reason = pWVar24->clause;
        if (pWVar24->size == 2) {
          if (pcVar8[(int)uVar20] < '\0') {
            this->conflict = reason;
            goto LAB_00857360;
          }
          bVar26 = false;
          build_chain_for_units(this,uVar20,reason,false);
          __position._M_current = (Watch *)(ulong)uVar20;
          search_assign(this,uVar20,reason);
        }
        else {
          bVar26 = true;
          if (this->conflict == (Clause *)0x0) {
            if ((reason->field_0x8 & 0x10) == 0) {
              uVar20 = *(uint *)&reason[1].field_0 ^ *(uint *)((long)&reason[1].field_0 + 4) ^
                       uVar15;
              cVar3 = pcVar8[(int)uVar20];
              if (cVar3 < '\x01') {
                uVar13 = reason->size;
                local_50 = (ulong)uVar13;
                uVar22 = (ulong)reason->pos;
                puVar14 = (uint *)((long)&reason[1].field_0 + uVar22 * 4);
                if (reason->pos == uVar13) {
                  __position._M_current = (Watch *)0x0;
                  cVar21 = -1;
                }
                else {
                  lVar18 = (long)(int)uVar13 * 4 + uVar22 * -4;
                  do {
                    __position._M_current = (Watch *)(long)(int)*puVar14;
                    cVar21 = pcVar8[(long)__position._M_current];
                    if (-1 < cVar21) break;
                    puVar14 = puVar14 + 1;
                    lVar18 = lVar18 + -4;
                  } while (lVar18 != 0);
                }
                if ((cVar21 < '\0') &&
                   (puVar14 = (uint *)&reason[1].field_0x8, (uVar22 & 0x3fffffffffffffff) != 2)) {
                  lVar18 = uVar22 * 4 + -8;
                  do {
                    __position._M_current = (Watch *)(long)(int)*puVar14;
                    cVar21 = pcVar8[(long)__position._M_current];
                    if (-1 < cVar21) break;
                    puVar14 = puVar14 + 1;
                    lVar18 = lVar18 + -4;
                  } while (lVar18 != 0);
                }
                reason->pos = (int)((ulong)((long)puVar14 - (long)(reason + 1)) >> 2);
                uVar13 = (uint)__position._M_current;
                if (cVar21 < '\x01') {
                  if (cVar21 != '\0') {
                    if (cVar3 == '\0') {
                      bVar26 = false;
                      build_chain_for_units(this,uVar20,reason,false);
                      __position._M_current = (Watch *)(ulong)uVar20;
                      search_assign(this,uVar20,reason);
                      if (1 < (this->opts).chrono) {
                        uVar13 = -uVar20;
                        if (0 < (int)uVar20) {
                          uVar13 = uVar20;
                        }
                        pVVar9 = (this->vtab).
                                 super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        bVar26 = false;
                        uVar19 = 0;
                        if (*(int *)((long)&pVVar9->level + local_40) < pVVar9[uVar13].level) {
                          uVar22 = 2;
                          uVar17 = (uint)local_50;
                          if (2 < (int)uVar17) {
                            lVar18 = 0;
                            do {
                              uVar19 = *(uint *)(&reason[1].field_0x8 + lVar18 * 4);
                              uVar10 = -uVar19;
                              if (0 < (int)uVar19) {
                                uVar10 = uVar19;
                              }
                              if (pVVar9[uVar10].level == pVVar9[uVar13].level) {
                                uVar17 = (int)lVar18 + 2;
                                break;
                              }
                              lVar18 = lVar18 + 1;
                            } while (local_50 - 2 != lVar18);
                            uVar22 = (ulong)uVar17;
                          }
                          *(uint *)((long)&reason[1].field_0 + uVar22 * 4) = uVar15;
                          *(uint *)&reason[1].field_0 = uVar20;
                          *(uint *)((long)&reason[1].field_0 + 4) = uVar19;
                          uVar13 = -uVar19;
                          if (0 < (int)uVar19) {
                            uVar13 = uVar19;
                          }
                          this_00 = (this->wtab).
                                    super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                    (uVar13 << 1 | uVar19 >> 0x1f);
                          local_60.size = reason->size;
                          local_60.blit = uVar20;
                          goto LAB_008574db;
                        }
                      }
                    }
                    else {
                      this->conflict = reason;
                    }
                    goto LAB_00857362;
                  }
                  *(uint *)&reason[1].field_0 = uVar20;
                  *(uint *)((long)&reason[1].field_0 + 4) = uVar13;
                  *puVar14 = uVar15;
                  uVar20 = -uVar13;
                  if (0 < (int)uVar13) {
                    uVar20 = uVar13;
                  }
                  this_00 = (this->wtab).
                            super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            (uVar20 << 1 | uVar13 >> 0x1f);
                  local_60.size = reason->size;
                  local_60.blit = uVar15;
LAB_008574db:
                  __position._M_current =
                       (this_00->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  local_60.clause = reason;
                  if (__position._M_current ==
                      (this_00->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::
                    _M_realloc_insert<CaDiCaL::Watch>(this_00,__position,&local_60);
                  }
                  else {
                    (__position._M_current)->clause = reason;
                    (__position._M_current)->blit = local_60.blit;
                    (__position._M_current)->size = local_60.size;
                    ppWVar1 = &(this_00->
                               super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppWVar1 = *ppWVar1 + 1;
                  }
                  goto LAB_008575a2;
                }
                pWVar24->blit = uVar13;
              }
              else {
                pWVar24->blit = uVar20;
              }
              goto LAB_00857360;
            }
LAB_008575a2:
            bVar26 = false;
            pWVar23 = pWVar24;
          }
        }
      }
      else {
LAB_00857360:
        bVar26 = false;
      }
LAB_00857362:
      pWVar25 = pWVar25 + 1;
      pWVar24 = pWVar23;
    } while (!bVar26);
    if (pWVar23 != pWVar25) {
      for (; pWVar25 != pWVar7; pWVar25 = pWVar25 + 1) {
        iVar11 = pWVar25->blit;
        iVar12 = pWVar25->size;
        pWVar23->clause = pWVar25->clause;
        pWVar23->blit = iVar11;
        pWVar23->size = iVar12;
        pWVar23 = pWVar23 + 1;
      }
      __position._M_current =
           (Watch *)((long)pWVar23 -
                     (long)(local_38->
                           super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::resize
                (local_38,(size_type)__position._M_current);
    }
  }
  if (this->searching_lucky_phases == false) {
    sVar16 = this->propagated;
    piVar2 = &(this->stats).propagations.search;
    *piVar2 = *piVar2 + (sVar16 - local_48);
    if (!bVar26) {
      if (this->stable == true) {
        piVar2 = &(this->stats).stabconflicts;
        *piVar2 = *piVar2 + 1;
      }
      piVar2 = &(this->stats).conflicts;
      *piVar2 = *piVar2 + 1;
      sVar16 = (size_t)(this->control).
                       super__Vector_base<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_>._M_impl.
                       super__Vector_impl_data._M_start[this->level].trail;
    }
    this->no_conflict_until = sVar16;
  }
  pIVar4 = this->internal;
  if ((pIVar4->profiles).propagate.level <= (pIVar4->opts).profile) {
    time(pIVar4,(time_t *)__position._M_current);
    stop_profiling(pIVar4,&(pIVar4->profiles).propagate,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  return this->conflict == (Clause *)0x0;
}

Assistant:

bool Internal::propagate () {

  if (level)
    require_mode (SEARCH);
  assert (!unsat);

  START (propagate);

  // Updating statistics counter in the propagation loops is costly so we
  // delay until propagation ran to completion.
  //
  int64_t before = propagated;

  while (!conflict && propagated != trail.size ()) {

    const int lit = -trail[propagated++];
    LOG ("propagating %d", -lit);
    Watches &ws = watches (lit);

    const const_watch_iterator eow = ws.end ();
    watch_iterator j = ws.begin ();
    const_watch_iterator i = j;

    while (i != eow) {

      const Watch w = *j++ = *i++;
      const signed char b = val (w.blit);

      if (b > 0)
        continue; // blocking literal satisfied

      if (w.binary ()) {

        // assert (w.clause->redundant || !w.clause->garbage);

        // In principle we can ignore garbage binary clauses too, but that
        // would require to dereference the clause pointer all the time with
        //
        // if (w.clause->garbage) { j--; continue; } // (*)
        //
        // This is too costly.  It is however necessary to produce correct
        // proof traces if binary clauses are traced to be deleted ('d ...'
        // line) immediately as soon they are marked as garbage.  Actually
        // finding instances where this happens is pretty difficult (six
        // parallel fuzzing jobs in parallel took an hour), but it does
        // occur.  Our strategy to avoid generating incorrect proofs now is
        // to delay tracing the deletion of binary clauses marked as garbage
        // until they are really deleted from memory.  For large clauses
        // this is not necessary since we have to access the clause anyhow.
        //
        // Thanks go to Mathias Fleury, who wanted me to explain why the
        // line '(*)' above was in the code. Removing it actually really
        // improved running times and thus I tried to find concrete
        // instances where this happens (which I found), and then
        // implemented the described fix.

        // Binary clauses are treated separately since they do not require
        // to access the clause at all (only during conflict analysis, and
        // there also only to simplify the code).

        if (b < 0)
          conflict = w.clause; // but continue ...
        else {
          build_chain_for_units (w.blit, w.clause, 0);
          search_assign (w.blit, w.clause);
          // lrat_chain.clear (); done in search_assign
        }

      } else {
        assert (w.clause->size > 2);

        if (conflict)
          break; // Stop if there was a binary conflict already.

        // The cache line with the clause data is forced to be loaded here
        // and thus this first memory access below is the real hot-spot of
        // the solver.  Note, that this check is positive very rarely and
        // thus branch prediction should be almost perfect here.

        if (w.clause->garbage) {
          j--;
          continue;
        }

        literal_iterator lits = w.clause->begin ();

        // Simplify code by forcing 'lit' to be the second literal in the
        // clause.  This goes back to MiniSAT.  We use a branch-less version
        // for conditionally swapping the first two literals, since it
        // turned out to be substantially faster than this one
        //
        //  if (lits[0] == lit) swap (lits[0], lits[1]);
        //
        // which achieves the same effect, but needs a branch.
        //
        const int other = lits[0] ^ lits[1] ^ lit;
        const signed char u = val (other); // value of the other watch

        if (u > 0)
          j[-1].blit = other; // satisfied, just replace blit
        else {

          // This follows Ian Gent's (JAIR'13) idea of saving the position
          // of the last watch replacement.  In essence it needs two copies
          // of the default search for a watch replacement (in essence the
          // code in the 'if (v < 0) { ... }' block below), one starting at
          // the saved position until the end of the clause and then if that
          // one failed to find a replacement another one starting at the
          // first non-watched literal until the saved position.

          const int size = w.clause->size;
          const literal_iterator middle = lits + w.clause->pos;
          const const_literal_iterator end = lits + size;
          literal_iterator k = middle;

          // Find replacement watch 'r' at position 'k' with value 'v'.

          int r = 0;
          signed char v = -1;

          while (k != end && (v = val (r = *k)) < 0)
            k++;

          if (v < 0) { // need second search starting at the head?

            k = lits + 2;
            assert (w.clause->pos <= size);
            while (k != middle && (v = val (r = *k)) < 0)
              k++;
          }

          w.clause->pos = k - lits; // always save position

          assert (lits + 2 <= k), assert (k <= w.clause->end ());

          if (v > 0) {

            // Replacement satisfied, so just replace 'blit'.

            j[-1].blit = r;

          } else if (!v) {

            // Found new unassigned replacement literal to be watched.

            LOG (w.clause, "unwatch %d in", lit);

            lits[0] = other;
            lits[1] = r;
            *k = lit;

            watch_literal (r, lit, w.clause);

            j--; // Drop this watch from the watch list of 'lit'.

          } else if (!u) {

            assert (v < 0);

            // The other watch is unassigned ('!u') and all other literals
            // assigned to false (still 'v < 0'), thus we found a unit.
            //
            build_chain_for_units (other, w.clause, 0);
            search_assign (other, w.clause);
            // lrat_chain.clear (); done in search_assign

            // Similar code is in the implementation of the SAT'18 paper on
            // chronological backtracking but in our experience, this code
            // first does not really seem to be necessary for correctness,
            // and further does not improve running time either.
            //
            if (opts.chrono > 1) {

              const int other_level = var (other).level;

              if (other_level > var (lit).level) {

                // The assignment level of the new unit 'other' is larger
                // than the assignment level of 'lit'.  Thus we should find
                // another literal in the clause at that higher assignment
                // level and watch that instead of 'lit'.

                assert (size > 2);

                int pos, s = 0;

                for (pos = 2; pos < size; pos++)
                  if (var (s = lits[pos]).level == other_level)
                    break;

                assert (s);
                assert (pos < size);

                LOG (w.clause, "unwatch %d in", lit);
                lits[pos] = lit;
                lits[0] = other;
                lits[1] = s;
                watch_literal (s, other, w.clause);

                j--; // Drop this watch from the watch list of 'lit'.
              }
            }
          } else {

            assert (u < 0);
            assert (v < 0);

            // The other watch is assigned false ('u < 0') and all other
            // literals as well (still 'v < 0'), thus we found a conflict.

            conflict = w.clause;
            break;
          }
        }
      }
    }

    if (j != i) {

      while (i != eow)
        *j++ = *i++;

      ws.resize (j - ws.begin ());
    }
  }

  if (searching_lucky_phases) {

    if (conflict)
      LOG (conflict, "ignoring lucky conflict");

  } else {

    // Avoid updating stats eagerly in the hot-spot of the solver.
    //
    stats.propagations.search += propagated - before;

    if (!conflict)
      no_conflict_until = propagated;
    else {

      if (stable)
        stats.stabconflicts++;
      stats.conflicts++;

      LOG (conflict, "conflict");

      // The trail before the current decision level was conflict free.
      //
      no_conflict_until = control[level].trail;
    }
  }

  STOP (propagate);

  return !conflict;
}